

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHingeConstraint.cpp
# Opt level: O3

void __thiscall
btHingeConstraint::btHingeConstraint
          (btHingeConstraint *this,btRigidBody *rbA,btVector3 *pivotInA,btVector3 *axisInA,
          bool useReferenceFrameA)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  btScalar bVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float local_e8;
  float fStack_e4;
  float local_d8;
  float fStack_d4;
  float local_c8;
  float fStack_c4;
  float local_98;
  
  btTypedConstraint::btTypedConstraint(&this->super_btTypedConstraint,HINGE_CONSTRAINT_TYPE,rbA);
  (this->super_btTypedConstraint)._vptr_btTypedConstraint =
       (_func_int **)&PTR__btTypedConstraint_00220380;
  (this->m_limit).m_center = 0.0;
  (this->m_limit).m_halfRange = -1.0;
  (this->m_limit).m_softness = 0.9;
  (this->m_limit).m_biasFactor = 0.3;
  (this->m_limit).m_relaxationFactor = 1.0;
  (this->m_limit).m_correction = 0.0;
  (this->m_limit).m_sign = 0.0;
  (this->m_limit).m_solveLimit = false;
  this->m_angularOnly = false;
  this->m_enableAngularMotor = false;
  this->m_useSolveConstraintObsolete = false;
  this->m_useOffsetForConstraintFrame = true;
  this->m_useReferenceFrameA = useReferenceFrameA;
  this->m_flags = 0;
  this->m_normalCFM = 0.0;
  this->m_normalERP = 0.0;
  this->m_stopCFM = 0.0;
  this->m_stopERP = 0.0;
  fVar19 = axisInA->m_floats[2];
  if (ABS(fVar19) <= 0.70710677) {
    fVar18 = axisInA->m_floats[0];
    fVar20 = axisInA->m_floats[1];
    fVar12 = fVar18 * fVar18 + fVar20 * fVar20;
    fVar21 = 1.0 / SQRT(fVar12);
    fVar18 = fVar18 * fVar21;
    bVar5 = fVar12 * fVar21;
    fVar21 = fVar21 * -fVar20;
    fVar12 = fVar18 * -fVar19;
    fVar19 = fVar19 * fVar21;
    fVar20 = 0.0;
  }
  else {
    fVar20 = axisInA->m_floats[1];
    fVar12 = fVar20 * fVar20 + fVar19 * fVar19;
    fVar18 = 1.0 / SQRT(fVar12);
    fVar20 = fVar20 * fVar18;
    fVar12 = fVar12 * fVar18;
    fVar18 = fVar18 * -fVar19;
    fVar19 = fVar20 * -axisInA->m_floats[0];
    bVar5 = axisInA->m_floats[0] * fVar18;
    fVar21 = 0.0;
  }
  uVar3 = *(undefined8 *)(pivotInA->m_floats + 2);
  *(undefined8 *)(this->m_rbAFrame).m_origin.m_floats = *(undefined8 *)pivotInA->m_floats;
  *(undefined8 *)((this->m_rbAFrame).m_origin.m_floats + 2) = uVar3;
  (this->m_rbAFrame).m_basis.m_el[0].m_floats[0] = fVar21;
  (this->m_rbAFrame).m_basis.m_el[0].m_floats[1] = fVar12;
  (this->m_rbAFrame).m_basis.m_el[0].m_floats[2] = axisInA->m_floats[0];
  (this->m_rbAFrame).m_basis.m_el[0].m_floats[3] = 0.0;
  *(ulong *)(this->m_rbAFrame).m_basis.m_el[1].m_floats = CONCAT44(fVar19,fVar18);
  (this->m_rbAFrame).m_basis.m_el[1].m_floats[2] = axisInA->m_floats[1];
  (this->m_rbAFrame).m_basis.m_el[1].m_floats[3] = 0.0;
  (this->m_rbAFrame).m_basis.m_el[2].m_floats[0] = fVar20;
  (this->m_rbAFrame).m_basis.m_el[2].m_floats[1] = bVar5;
  (this->m_rbAFrame).m_basis.m_el[2].m_floats[2] = axisInA->m_floats[2];
  (this->m_rbAFrame).m_basis.m_el[2].m_floats[3] = 0.0;
  local_d8 = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[0];
  local_e8 = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[1];
  fVar19 = axisInA->m_floats[0];
  local_c8 = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[2];
  fStack_d4 = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[0];
  fStack_e4 = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[1];
  fStack_c4 = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[2];
  local_98 = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[0];
  fVar12 = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[1];
  fVar1 = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[2];
  fVar16 = (float)*(undefined8 *)(axisInA->m_floats + 1);
  fVar14 = (float)((ulong)*(undefined8 *)(axisInA->m_floats + 1) >> 0x20);
  fVar9 = fStack_c4 * fVar14 + fStack_d4 * fVar19 + fVar16 * fStack_e4;
  fVar10 = fVar1 * fVar14 + fVar19 * local_98 + fVar16 * fVar12;
  fVar11 = local_c8 * fVar14 + fVar19 * local_d8 + fVar16 * local_e8;
  fVar6 = fVar14 * fVar10 + fVar11 * fVar19 + fVar16 * fVar9;
  if (-0.9999999 <= fVar6) {
    fVar6 = fVar6 + 1.0;
    fVar6 = fVar6 + fVar6;
    if (fVar6 < 0.0) {
      fVar6 = sqrtf(fVar6);
    }
    else {
      fVar6 = SQRT(fVar6);
    }
    fVar7 = 1.0 / fVar6;
    fVar13 = fVar7 * (fVar16 * fVar10 + -fVar14 * fVar9);
    fVar14 = fVar7 * (fVar14 * fVar11 + -fVar19 * fVar10);
    fVar7 = fVar7 * (fVar19 * fVar9 + -fVar16 * fVar11);
    fVar6 = fVar6 * 0.5;
    local_d8 = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[0];
    local_e8 = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[1];
    local_c8 = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[2];
    local_98 = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[0];
    fVar12 = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[1];
    fVar1 = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[2];
    fStack_c4 = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[2];
    fStack_d4 = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[0];
    fStack_e4 = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[1];
  }
  else {
    if (ABS(fVar14) <= 0.70710677) {
      fVar14 = 1.0 / SQRT(fVar19 * fVar19 + fVar16 * fVar16);
      fVar13 = -fVar16 * fVar14;
      fVar14 = fVar14 * fVar19;
      fVar7 = 0.0;
    }
    else {
      fVar7 = 1.0 / SQRT(fVar16 * fVar16 + fVar14 * fVar14);
      fVar14 = -fVar14 * fVar7;
      fVar7 = fVar7 * fVar16;
      fVar13 = 0.0;
    }
    fVar6 = 0.0;
  }
  fVar8 = (fVar6 * fVar18 + fVar21 * fVar7) - fVar13 * fVar20;
  fVar17 = (fVar6 * fVar20 + fVar18 * fVar13) - fVar14 * fVar21;
  fVar15 = (-fVar13 * fVar21 - fVar18 * fVar14) - fVar20 * fVar7;
  fVar19 = pivotInA->m_floats[1];
  fVar16 = pivotInA->m_floats[0];
  fVar2 = pivotInA->m_floats[2];
  uVar3 = *(undefined8 *)(rbA->super_btCollisionObject).m_worldTransform.m_origin.m_floats;
  auVar4._4_4_ = (float)((ulong)uVar3 >> 0x20) +
                 fVar2 * fStack_c4 + fVar16 * fStack_d4 + fVar19 * fStack_e4;
  auVar4._0_4_ = (float)uVar3 + fVar2 * local_c8 + fVar16 * local_d8 + fVar19 * local_e8;
  auVar4._8_4_ = fVar1 * fVar2 + local_98 * fVar16 + fVar12 * fVar19 +
                 (rbA->super_btCollisionObject).m_worldTransform.m_origin.m_floats[2];
  auVar4._12_4_ = 0;
  *(undefined1 (*) [16])(this->m_rbBFrame).m_origin.m_floats = auVar4;
  fVar20 = (fVar6 * fVar21 + fVar20 * fVar14) - fVar18 * fVar7;
  fVar18 = fVar17 * fVar14 + ((fVar6 * fVar20 - fVar15 * fVar13) - fVar8 * fVar7);
  fVar19 = fVar8 * fVar13 + ((fVar6 * fVar17 - fVar15 * fVar7) - fVar14 * fVar20);
  fVar20 = fVar7 * fVar20 + ((fVar6 * fVar8 - fVar15 * fVar14) - fVar17 * fVar13);
  (this->m_rbBFrame).m_basis.m_el[0].m_floats[2] = fVar11;
  (this->m_rbBFrame).m_basis.m_el[0].m_floats[3] = 0.0;
  (this->m_rbBFrame).m_basis.m_el[0].m_floats[0] = fVar18;
  (this->m_rbBFrame).m_basis.m_el[0].m_floats[1] = fVar9 * fVar19 - fVar20 * fVar10;
  *(ulong *)(this->m_rbBFrame).m_basis.m_el[1].m_floats =
       CONCAT44(fVar10 * fVar18 + -fVar11 * fVar19,fVar20);
  (this->m_rbBFrame).m_basis.m_el[1].m_floats[2] = fVar9;
  (this->m_rbBFrame).m_basis.m_el[1].m_floats[3] = 0.0;
  (this->m_rbBFrame).m_basis.m_el[2].m_floats[0] = fVar19;
  (this->m_rbBFrame).m_basis.m_el[2].m_floats[1] = fVar11 * fVar20 - fVar18 * fVar9;
  (this->m_rbBFrame).m_basis.m_el[2].m_floats[2] = fVar10;
  (this->m_rbBFrame).m_basis.m_el[2].m_floats[3] = 0.0;
  if (this->m_useReferenceFrameA == false) {
    bVar5 = 1.0;
  }
  else {
    bVar5 = -1.0;
  }
  this->m_referenceSign = bVar5;
  return;
}

Assistant:

btHingeConstraint::btHingeConstraint(btRigidBody& rbA,const btVector3& pivotInA,const btVector3& axisInA, bool useReferenceFrameA)
:btTypedConstraint(HINGE_CONSTRAINT_TYPE, rbA),
#ifdef _BT_USE_CENTER_LIMIT_
m_limit(),
#endif
m_angularOnly(false), m_enableAngularMotor(false), 
m_useSolveConstraintObsolete(HINGE_USE_OBSOLETE_SOLVER),
m_useOffsetForConstraintFrame(HINGE_USE_FRAME_OFFSET),
m_useReferenceFrameA(useReferenceFrameA),
m_flags(0),
m_normalCFM(0),
m_normalERP(0),
m_stopCFM(0),
m_stopERP(0)
{

	// since no frame is given, assume this to be zero angle and just pick rb transform axis
	// fixed axis in worldspace
	btVector3 rbAxisA1, rbAxisA2;
	btPlaneSpace1(axisInA, rbAxisA1, rbAxisA2);

	m_rbAFrame.getOrigin() = pivotInA;
	m_rbAFrame.getBasis().setValue( rbAxisA1.getX(),rbAxisA2.getX(),axisInA.getX(),
									rbAxisA1.getY(),rbAxisA2.getY(),axisInA.getY(),
									rbAxisA1.getZ(),rbAxisA2.getZ(),axisInA.getZ() );

	btVector3 axisInB = rbA.getCenterOfMassTransform().getBasis() * axisInA;

	btQuaternion rotationArc = shortestArcQuat(axisInA,axisInB);
	btVector3 rbAxisB1 =  quatRotate(rotationArc,rbAxisA1);
	btVector3 rbAxisB2 = axisInB.cross(rbAxisB1);


	m_rbBFrame.getOrigin() = rbA.getCenterOfMassTransform()(pivotInA);
	m_rbBFrame.getBasis().setValue( rbAxisB1.getX(),rbAxisB2.getX(),axisInB.getX(),
									rbAxisB1.getY(),rbAxisB2.getY(),axisInB.getY(),
									rbAxisB1.getZ(),rbAxisB2.getZ(),axisInB.getZ() );
	
#ifndef	_BT_USE_CENTER_LIMIT_
	//start with free
	m_lowerLimit = btScalar(1.0f);
	m_upperLimit = btScalar(-1.0f);
	m_biasFactor = 0.3f;
	m_relaxationFactor = 1.0f;
	m_limitSoftness = 0.9f;
	m_solveLimit = false;
#endif
	m_referenceSign = m_useReferenceFrameA ? btScalar(-1.f) : btScalar(1.f);
}